

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::TableModuleField::~TableModuleField(TableModuleField *this)

{
  ~TableModuleField(this);
  operator_delete(this);
  return;
}

Assistant:

explicit TableModuleField(const Location& loc = Location(),
                            string_view name = string_view())
      : ModuleFieldMixin<ModuleFieldType::Table>(loc), table(name) {}